

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
  *this_00;
  uint *puVar1;
  long lVar2;
  vec<16U,_float> *pvVar3;
  VectorInfo *pVVar4;
  double *pdVar5;
  raw_node *prVar6;
  double dVar7;
  double dVar8;
  uint new_hash_size;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  hash_map_type *phVar16;
  bool bVar17;
  uint i_3;
  uint32 uVar18;
  vq_node *pvVar19;
  executable_task *pObj;
  value_type *pvVar20;
  uint uVar21;
  vq_node *pvVar22;
  uint i;
  uint uVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  undefined7 in_register_00000089;
  vec<16U,_float> *pvVar29;
  ulong uVar30;
  vec<16U,_float> *pvVar31;
  int iVar32;
  uint i_2;
  ulong uVar33;
  bool bVar34;
  float fVar35;
  float fVar36;
  uint end_node;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
  params;
  vec<16U,_float> result;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  node_queue;
  uint local_158;
  uint local_154;
  vector<crnlib::vec<16U,_float>_> *local_150;
  insert_result local_148;
  ulong local_130;
  node_vec_type *local_128;
  undefined4 local_11c;
  undefined1 local_118 [16];
  value_type local_108;
  value_type vStack_100;
  value_type local_f8;
  value_type vStack_f0;
  value_type local_e8;
  value_type vStack_e0;
  float local_d8 [4];
  vector<double> *local_c8;
  elemental_vector *local_c0;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  float fStack_50;
  undefined4 uStack_4c;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined2 local_38;
  undefined1 local_36;
  
  local_11c = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  uVar33 = (ulong)max_splits;
  this->m_vectors = vectors;
  uVar24 = (this->m_vectorsInfo).m_size;
  if (uVar24 != size) {
    if ((uVar24 <= size) && ((this->m_vectorsInfo).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfo,size,uVar24 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfo).m_size = size;
  }
  local_150 = &this->m_weightedVectors;
  uVar24 = (this->m_weightedVectors).m_size;
  if (uVar24 != size) {
    if ((uVar24 <= size) && ((this->m_weightedVectors).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)local_150,size,uVar24 + 1 == size,0x40,(object_mover)0x0,false)
      ;
    }
    (this->m_weightedVectors).m_size = size;
  }
  local_c8 = &this->m_weightedDotProducts;
  uVar24 = (this->m_weightedDotProducts).m_size;
  if (uVar24 != size) {
    if (uVar24 <= size) {
      if ((this->m_weightedDotProducts).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_c8,size,uVar24 + 1 == size,8,(object_mover)0x0,false);
      }
      uVar24 = (this->m_weightedDotProducts).m_size;
      memset((this->m_weightedDotProducts).m_p + uVar24,0,(ulong)(size - uVar24) << 3);
    }
    (this->m_weightedDotProducts).m_size = size;
  }
  uVar24 = (this->m_vectorsInfoLeft).m_size;
  if (uVar24 != size) {
    if ((uVar24 <= size) && ((this->m_vectorsInfoLeft).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoLeft,size,uVar24 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoLeft).m_size = size;
  }
  uVar24 = (this->m_vectorsInfoRight).m_size;
  if (uVar24 != size) {
    if ((uVar24 <= size) && ((this->m_vectorsInfoRight).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoRight,size,uVar24 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoRight).m_size = size;
  }
  uVar24 = (this->m_vectorComparison).m_size;
  if (uVar24 != size) {
    if (uVar24 <= size) {
      if ((this->m_vectorComparison).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_vectorComparison,size,uVar24 + 1 == size,1,
                   (object_mover)0x0,false);
      }
      uVar24 = (this->m_vectorComparison).m_size;
      memset((this->m_vectorComparison).m_p + uVar24,0,(ulong)(size - uVar24));
    }
    (this->m_vectorComparison).m_size = size;
  }
  local_128 = &this->m_nodes;
  uVar23 = max_splits * 4;
  uVar24 = (this->m_nodes).m_size;
  local_130 = uVar33;
  if (uVar24 != uVar23) {
    if (uVar24 <= uVar23) {
      if ((this->m_nodes).m_capacity < uVar23) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_128,uVar23,uVar24 + 1 == uVar23,0x68,
                   vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::object_mover
                   ,false);
      }
      uVar24 = (this->m_nodes).m_size;
      uVar21 = uVar23 - uVar24;
      if (uVar21 != 0) {
        pvVar19 = (this->m_nodes).m_p + uVar24;
        pvVar22 = pvVar19 + uVar21;
        do {
          (pvVar19->m_centroid).m_s[0xc] = 0.0;
          (pvVar19->m_centroid).m_s[0xd] = 0.0;
          (pvVar19->m_centroid).m_s[0xe] = 0.0;
          (pvVar19->m_centroid).m_s[0xf] = 0.0;
          (pvVar19->m_centroid).m_s[8] = 0.0;
          (pvVar19->m_centroid).m_s[9] = 0.0;
          (pvVar19->m_centroid).m_s[10] = 0.0;
          (pvVar19->m_centroid).m_s[0xb] = 0.0;
          (pvVar19->m_centroid).m_s[4] = 0.0;
          (pvVar19->m_centroid).m_s[5] = 0.0;
          (pvVar19->m_centroid).m_s[6] = 0.0;
          (pvVar19->m_centroid).m_s[7] = 0.0;
          (pvVar19->m_centroid).m_s[0] = 0.0;
          (pvVar19->m_centroid).m_s[1] = 0.0;
          (pvVar19->m_centroid).m_s[2] = 0.0;
          (pvVar19->m_centroid).m_s[3] = 0.0;
          pvVar19->m_total_weight = 0;
          pvVar19->m_left = -1;
          pvVar19->m_right = -1;
          pvVar19->m_codebook_index = -1;
          pvVar19->m_unsplittable = false;
          pvVar19->m_alternative = false;
          pvVar19->m_processed = false;
          pvVar19 = pvVar19 + 1;
        } while (pvVar19 != pvVar22);
      }
    }
    (this->m_nodes).m_size = uVar23;
  }
  local_c0 = (elemental_vector *)&this->m_codebook;
  pvVar3 = (this->m_codebook).m_p;
  if (pvVar3 != (vec<16U,_float> *)0x0) {
    crnlib_free(pvVar3);
    local_c0->m_p = (vec<16U,_float> *)0x0;
    *(undefined8 *)&local_c0->m_size = 0;
  }
  uVar33 = local_130;
  if (pTask_pool == (task_pool *)0x0) {
    local_158 = 1;
  }
  else {
    local_158 = pTask_pool->m_num_threads + 1;
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_58 = 0;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_38 = 0;
  local_36 = 0;
  uStack_4c = 0;
  uVar27 = (ulong)(this->m_vectorsInfo).m_size;
  if (uVar27 == 0) {
    dVar7 = 0.0;
  }
  else {
    pVVar4 = (this->m_vectorsInfo).m_p;
    pvVar3 = local_150->m_p;
    pdVar5 = local_c8->m_p;
    dVar7 = 0.0;
    local_58 = 0;
    uVar28 = 0;
    pvVar29 = pvVar3;
    pvVar31 = vectors;
    do {
      pvVar20 = (value_type *)(pvVar3 + uVar28);
      pVVar4[uVar28].index = (uint)uVar28;
      uVar24 = weights[uVar28];
      pVVar4[uVar28].weight = uVar24;
      fVar35 = (float)uVar24;
      lVar25 = 0;
      do {
        *(float *)(local_118 + lVar25 * 4) = pvVar31->m_s[lVar25] * fVar35;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x10);
      pvVar20[6] = local_e8;
      pvVar20[7] = vStack_e0;
      pvVar20[4] = local_f8;
      pvVar20[5] = vStack_f0;
      pvVar20[2] = local_108;
      pvVar20[3] = vStack_100;
      pvVar20->m_index = local_118._0_4_;
      pvVar20->m_variance = (float)local_118._4_4_;
      pvVar20[1].m_index = local_118._8_4_;
      pvVar20[1].m_variance = (float)local_118._12_4_;
      lVar25 = 0;
      do {
        *(float *)((long)&local_98 + lVar25 * 4) =
             pvVar29->m_s[lVar25] + *(float *)((long)&local_98 + lVar25 * 4);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x10);
      fVar36 = vectors[uVar28].m_s[0] * vectors[uVar28].m_s[0];
      lVar25 = 1;
      do {
        fVar36 = fVar36 + pvVar31->m_s[lVar25] * pvVar31->m_s[lVar25];
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x10);
      local_58 = local_58 + uVar24;
      dVar8 = (double)(fVar36 * fVar35);
      pdVar5[uVar28] = dVar8;
      dVar7 = dVar7 + dVar8;
      uVar28 = uVar28 + 1;
      pvVar31 = pvVar31 + 1;
      pvVar29 = pvVar29 + 1;
    } while (uVar28 != uVar27);
  }
  uVar24 = (uint)local_130;
  fVar35 = (float)local_98 * (float)local_98;
  lVar25 = 1;
  do {
    fVar36 = *(float *)((long)&local_98 + lVar25 * 4);
    fVar35 = fVar35 + fVar36 * fVar36;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x10);
  fStack_50 = (float)(dVar7 - (double)(fVar35 / (float)local_58));
  lVar25 = 0;
  do {
    *(float *)((long)&local_98 + lVar25 * 4) =
         *(float *)((long)&local_98 + lVar25 * 4) * (1.0 / (float)local_58);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x10);
  local_b8.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_154 = 0;
  pvVar19 = local_128->m_p;
  *(undefined8 *)((pvVar19->m_centroid).m_s + 0xc) = local_68;
  *(undefined8 *)((pvVar19->m_centroid).m_s + 0xe) = uStack_60;
  *(undefined8 *)((pvVar19->m_centroid).m_s + 8) = local_78;
  *(undefined8 *)((pvVar19->m_centroid).m_s + 10) = uStack_70;
  *(undefined8 *)((pvVar19->m_centroid).m_s + 4) = local_88;
  *(undefined8 *)((pvVar19->m_centroid).m_s + 6) = uStack_80;
  *(undefined8 *)(pvVar19->m_centroid).m_s = local_98;
  *(undefined8 *)((pvVar19->m_centroid).m_s + 2) = uStack_90;
  *(undefined4 *)((long)&pvVar19->m_codebook_index + 3) = 0xff;
  pvVar19->m_end = size;
  pvVar19->m_left = 0xffffffff;
  pvVar19->m_right = -1;
  pvVar19->m_codebook_index = -1;
  pvVar19->m_total_weight = local_58;
  pvVar19->m_variance = (float)(int)(ulong)(uint)fStack_50;
  pvVar19->m_begin = (int)((ulong)(uint)fStack_50 >> 0x20);
  local_118._0_8_ = (ulong)(uint)fStack_50 << 0x20;
  local_48 = size;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::push(&local_b8,(value_type *)local_118);
  local_154 = local_154 + 1;
  uVar21 = 1;
  uVar23 = uVar21;
  if (1 < local_158) {
    if (1 < uVar24) {
      do {
        uVar23 = uVar21;
        if (((long)local_b8.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)local_158) ||
           (bVar17 = split_node(this,&local_b8,&local_154,pTask_pool), !bVar17)) break;
        uVar21 = uVar21 + 1;
        uVar23 = uVar24;
      } while (uVar24 != uVar21);
    }
    if ((long)local_b8.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_b8.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)local_158) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                *)local_118,&local_b8.c);
      local_150 = (vector<crnlib::vec<16U,_float>_> *)
                  CONCAT44(local_150._4_4_,(int)((uVar33 & 0xffffffff) / (ulong)local_158));
      local_148.first.m_pTable = (hash_map_type *)0x0;
      local_148.first.m_index = 0;
      local_148.first._12_4_ = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_148,local_158,false,0xc,(object_mover)0x0,false);
      local_148.first.m_index = local_158;
      if (local_118._0_8_ != local_118._8_8_) {
        iVar26 = (int)local_130 * 2;
        iVar32 = (uint)local_150 * 2;
        uVar24 = 0;
        do {
          phVar16 = local_148.first.m_pTable;
          uVar33 = (ulong)uVar24;
          *(undefined4 *)((long)&((local_148.first.m_pTable)->m_values).m_p + uVar33 * 0xc) =
               *(undefined4 *)local_118._0_8_;
          *(int *)((long)&((local_148.first.m_pTable)->m_values).m_p + uVar33 * 0xc + 4) = iVar26;
          (&((local_148.first.m_pTable)->m_values).m_size)[uVar33 * 3] = (uint)local_150;
          pObj = (executable_task *)crnlib_malloc(0x28);
          pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001cea50;
          pObj[1]._vptr_executable_task = (_func_int **)this;
          pObj[2]._vptr_executable_task = (_func_int **)split_alternative_node_task;
          pObj[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
          task_pool::queue_task
                    (pTask_pool,pObj,uVar33,(void *)((long)&(phVar16->m_values).m_p + uVar33 * 0xc))
          ;
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                 *)local_118);
          iVar26 = iVar26 + iVar32;
          uVar24 = uVar24 + 1;
        } while (local_118._0_8_ != local_118._8_8_);
      }
      task_pool::join(pTask_pool);
      uVar24 = (uint)local_130;
      if (local_148.first.m_pTable != (hash_map_type *)0x0) {
        crnlib_free(local_148.first.m_pTable);
      }
      if ((value_type)local_118._0_8_ != (value_type)0x0) {
        operator_delete((void *)local_118._0_8_);
      }
    }
  }
  if (uVar23 < uVar24) {
    iVar32 = ~uVar23 + uVar24;
    do {
      bVar17 = split_node(this,&local_b8,&local_154,pTask_pool);
      bVar34 = iVar32 != 0;
      iVar32 = iVar32 + -1;
    } while (bVar17 && bVar34);
  }
  if (local_154 != 0) {
    this_00 = &this->m_node_index_map;
    uVar33 = 0;
    do {
      pvVar19 = local_128->m_p;
      if ((pvVar19[uVar33].m_alternative != false) || (pvVar19[uVar33].m_left == -1)) {
        pvVar19 = pvVar19 + uVar33;
        uVar24 = (this->m_codebook).m_size;
        pvVar19->m_codebook_index = uVar24;
        if ((this->m_codebook).m_capacity <= uVar24) {
          elemental_vector::increase_capacity(local_c0,uVar24 + 1,true,0x40,(object_mover)0x0,false)
          ;
        }
        pvVar3 = (this->m_codebook).m_p;
        uVar24 = (this->m_codebook).m_size;
        uVar9 = *(undefined8 *)(pvVar19->m_centroid).m_s;
        uVar10 = *(undefined8 *)((pvVar19->m_centroid).m_s + 2);
        uVar11 = *(undefined8 *)((pvVar19->m_centroid).m_s + 4);
        uVar12 = *(undefined8 *)((pvVar19->m_centroid).m_s + 6);
        uVar13 = *(undefined8 *)((pvVar19->m_centroid).m_s + 8);
        uVar14 = *(undefined8 *)((pvVar19->m_centroid).m_s + 10);
        uVar15 = *(undefined8 *)((pvVar19->m_centroid).m_s + 0xe);
        *(undefined8 *)(pvVar3[uVar24].m_s + 0xc) = *(undefined8 *)((pvVar19->m_centroid).m_s + 0xc)
        ;
        *(undefined8 *)(pvVar3[uVar24].m_s + 0xc + 2) = uVar15;
        *(undefined8 *)(pvVar3[uVar24].m_s + 8) = uVar13;
        *(undefined8 *)(pvVar3[uVar24].m_s + 8 + 2) = uVar14;
        *(undefined8 *)(pvVar3[uVar24].m_s + 4) = uVar11;
        *(undefined8 *)(pvVar3[uVar24].m_s + 4 + 2) = uVar12;
        *(undefined8 *)pvVar3[uVar24].m_s = uVar9;
        *(undefined8 *)(pvVar3[uVar24].m_s + 2) = uVar10;
        puVar1 = &(this->m_codebook).m_size;
        *puVar1 = *puVar1 + 1;
        if (((char)local_11c != '\0') &&
           (uVar27 = (ulong)pvVar19->m_begin, pvVar19->m_begin < pvVar19->m_end)) {
LAB_00180508:
          pvVar3 = this->m_vectors;
          uVar24 = (this->m_vectorsInfo).m_p[uVar27].index;
          local_d8[0] = (float)pvVar19->m_codebook_index;
          local_118._0_8_ = *(value_type *)(pvVar3 + uVar24);
          local_118._8_8_ = ((value_type *)(pvVar3 + uVar24))[1];
          local_108 = *(value_type *)(pvVar3[uVar24].m_s + 4);
          vStack_100 = ((value_type *)(pvVar3[uVar24].m_s + 4))[1];
          local_f8 = *(value_type *)(pvVar3[uVar24].m_s + 8);
          vStack_f0 = ((value_type *)(pvVar3[uVar24].m_s + 8))[1];
          local_e8 = *(value_type *)(pvVar3[uVar24].m_s + 0xc);
          vStack_e0 = ((value_type *)(pvVar3[uVar24].m_s + 0xc))[1];
          local_148.first.m_pTable = (hash_map_type *)0x0;
          local_148.first._8_8_ = local_148.first._8_8_ & 0xffffffff00000000;
          local_148.second = false;
          if ((this->m_node_index_map).m_values.m_size == 0) goto LAB_001806cd;
          uVar18 = fast_hash((vec<16U,_float> *)local_118,0x40);
          uVar24 = uVar18 * -0x61c88647 >> ((byte)(this->m_node_index_map).m_hash_shift & 0x1f);
          prVar6 = (this->m_node_index_map).m_values.m_p;
          pvVar20 = (value_type *)(prVar6 + uVar24);
          if (*(char *)&pvVar20[8].m_variance == '\0') goto LAB_0018066f;
          if (((float)pvVar20->m_index != (float)local_118._0_4_) ||
             (NAN((float)pvVar20->m_index) || NAN((float)local_118._0_4_))) {
LAB_001805e9:
            uVar23 = (this->m_node_index_map).m_values.m_size - 1;
            bVar17 = uVar24 == 0;
            uVar28 = (ulong)(uVar24 - 1);
            if (bVar17) {
              uVar28 = (ulong)uVar23;
            }
            do {
              uVar21 = (uint)uVar28;
              pvVar20 = pvVar20 + -9;
              if (bVar17) {
                pvVar20 = (value_type *)(prVar6 + uVar23);
              }
              if (uVar24 == uVar21) {
                bVar17 = false;
LAB_00180666:
                bVar34 = false;
                goto LAB_00180668;
              }
              bVar17 = *(char *)&pvVar20[8].m_variance == '\0';
              if (bVar17) goto LAB_00180666;
              if (((float)pvVar20->m_index == (float)local_118._0_4_) &&
                 (!NAN((float)pvVar20->m_index) && !NAN((float)local_118._0_4_))) {
                uVar28 = 0xffffffffffffffff;
                while (uVar28 != 0xe) {
                  puVar1 = &pvVar20[1].m_index + uVar28;
                  uVar30 = uVar28 + 1;
                  lVar25 = uVar28 * 4;
                  if (((float)*puVar1 != *(float *)(local_118 + lVar25 + 8)) ||
                     (uVar28 = uVar30,
                     NAN((float)*puVar1) || NAN(*(float *)(local_118 + lVar25 + 8))))
                  goto LAB_0018064d;
                }
                uVar30 = 0xf;
LAB_0018064d:
                if (0xe < uVar30) goto LAB_0018072c;
              }
              bVar17 = uVar21 == 0;
              uVar21 = uVar21 - 1;
              if (bVar17) {
                uVar21 = uVar23;
              }
              uVar28 = (ulong)uVar21;
            } while( true );
          }
          uVar28 = 0xffffffffffffffff;
          while (uVar28 != 0xe) {
            lVar25 = uVar28 * 4;
            uVar30 = uVar28 + 1;
            lVar2 = uVar28 * 4;
            if ((*(float *)(prVar6[uVar24].m_bits + lVar25 + 8) != *(float *)(local_118 + lVar2 + 8)
                ) || (uVar28 = uVar30,
                     NAN(*(float *)(prVar6[uVar24].m_bits + lVar25 + 8)) ||
                     NAN(*(float *)(local_118 + lVar2 + 8)))) goto LAB_001805dc;
          }
          uVar30 = 0xf;
LAB_001805dc:
          if (uVar30 < 0xf) goto LAB_001805e9;
          local_148.second = false;
          goto LAB_001806b9;
        }
      }
LAB_00180745:
      uVar33 = uVar33 + 1;
    } while (uVar33 < local_154);
  }
  if (local_b8.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
LAB_0018072c:
  local_148.first.m_index = uVar21;
  local_148.second = false;
  bVar34 = true;
  bVar17 = false;
  local_148.first.m_pTable = this_00;
LAB_00180668:
  uVar24 = uVar21;
  if (bVar17) {
LAB_0018066f:
    if ((this->m_node_index_map).m_num_valid < (this->m_node_index_map).m_grow_threshold) {
      pvVar20[6] = local_e8;
      pvVar20[7] = vStack_e0;
      pvVar20[4] = local_f8;
      pvVar20[5] = vStack_f0;
      pvVar20[2] = local_108;
      pvVar20[3] = vStack_100;
      pvVar20->m_index = local_118._0_4_;
      pvVar20->m_variance = (float)local_118._4_4_;
      pvVar20[1].m_index = local_118._8_4_;
      pvVar20[1].m_variance = (float)local_118._12_4_;
      pvVar20[8].m_index = (uint)local_d8[0];
      *(undefined1 *)&pvVar20[8].m_variance = 1;
      puVar1 = &(this->m_node_index_map).m_num_valid;
      *puVar1 = *puVar1 + 1;
      local_148.second = true;
LAB_001806b9:
      local_148.first.m_index = uVar24;
      local_148.first.m_pTable = this_00;
      goto LAB_0018071a;
    }
  }
  else if (bVar34) goto LAB_0018071a;
LAB_001806cd:
  new_hash_size = (this->m_node_index_map).m_values.m_size * 2;
  if (new_hash_size < 5) {
    new_hash_size = 4;
  }
  hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
  ::rehash(this_00,new_hash_size);
  bVar17 = hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
           ::insert_no_grow(this_00,&local_148,(vec<16U,_float> *)local_118,(uint *)local_d8);
  if (!bVar17) {
    crnlib_fail("\"insert() failed\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                ,0x204);
  }
LAB_0018071a:
  uVar27 = uVar27 + 1;
  if (pvVar19->m_end <= uVar27) goto LAB_00180745;
  goto LAB_00180508;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0)
        {
            m_vectors = vectors;
            m_vectorsInfo.resize(size);
            m_weightedVectors.resize(size);
            m_weightedDotProducts.resize(size);
            m_vectorsInfoLeft.resize(size);
            m_vectorsInfoRight.resize(size);
            m_vectorComparison.resize(size);
            m_nodes.resize(max_splits << 2);
            m_codebook.clear();
            uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

            vq_node root;
            root.m_begin = 0;
            root.m_end = size;
            double ttsum = 0.0f;
            for (uint i = 0; i < m_vectorsInfo.size(); i++)
            {
                const VectorType& v = vectors[i];
                m_vectorsInfo[i].index = i;
                const uint weight = m_vectorsInfo[i].weight = weights[i];
                m_weightedVectors[i] = v * (float)weight;
                root.m_centroid += m_weightedVectors[i];
                root.m_total_weight += weight;
                m_weightedDotProducts[i] = v.dot(v) * weight;
                ttsum += m_weightedDotProducts[i];
            }
            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
            root.m_centroid *= (1.0f / root.m_total_weight);

            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = 0, end_node = begin_node, splits = 0;
            m_nodes[end_node] = root;
            node_queue.push(NodeInfo(end_node, root.m_variance));
            end_node++;
            splits++;

            if (num_tasks > 1)
            {
                while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
                {
                    splits++;
                }
                if (node_queue.size() == num_tasks)
                {
                    std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
                    uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
                    crnlib::vector<split_alternative_node_task_params> params(num_tasks);
                    for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++)
                    {
                        params[task].main_node = alternative_node_queue.top().m_index;
                        params[task].alternative_node = alternative_node;
                        params[task].max_splits = alternative_max_splits;
                        pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
                    }
                    pTask_pool->join();
                }
            }

            while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
            {
                splits++;
            }

            for (uint i = begin_node; i < end_node; i++)
            {
                vq_node& node = m_nodes[i];
                if (!node.m_alternative && node.m_left != -1)
                {
                    continue;
                }
                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);
                if (generate_node_index_map)
                {
                    for (uint j = node.m_begin; j < node.m_end; j++)
                    {
                        m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
                    }
                }
            }
        }